

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLogTestCase.cpp
# Opt level: O3

void __thiscall
SuiteFileLogTests::TestgenerateFileNameFixturegenerateFileName::
~TestgenerateFileNameFixturegenerateFileName(TestgenerateFileNameFixturegenerateFileName *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST_FIXTURE(generateFileNameFixture, generateFileName)
{
  object->onEvent( "EVENT1" );
  object->onIncoming( "INCOMING1" );
  object->onOutgoing( "OUTGOING1" );

  CHECK( file_exists("log/FIX.4.2-GENERATEFILENAME-TEST.event.current.log") );
  CHECK( file_exists("log/FIX.4.2-GENERATEFILENAME-TEST.messages.current.log") );

  object->backup();
  object->onEvent( "EVENT2" );
  object->onIncoming( "INCOMING2" );
  object->onOutgoing( "OUTGOING2" );

  CHECK( file_exists("log/backup/FIX.4.2-GENERATEFILENAME-TEST.event.backup.1.log") );
  CHECK( file_exists("log/backup/FIX.4.2-GENERATEFILENAME-TEST.messages.backup.1.log") );

  object->backup();
  object->onEvent( "EVENT3" );
  object->onIncoming( "INCOMING3" );
  object->onOutgoing( "OUTGOING3" );

  CHECK( file_exists("log/backup/FIX.4.2-GENERATEFILENAME-TEST.event.backup.2.log") );
  CHECK( file_exists("log/backup/FIX.4.2-GENERATEFILENAME-TEST.messages.backup.2.log") );

  object->backup();
  object->onEvent( "EVENT4" );
  object->onIncoming( "INCOMING4" );
  object->onOutgoing( "OUTGOING4" );

  CHECK( file_exists("log/backup/FIX.4.2-GENERATEFILENAME-TEST.event.backup.3.log") );
  CHECK( file_exists("log/backup/FIX.4.2-GENERATEFILENAME-TEST.messages.backup.3.log") );

  object->backup();
  object->onEvent( "EVENT5" );
  object->onIncoming( "INCOMING5" );
  object->onOutgoing( "OUTGOING5" );

  CHECK( file_exists("log/backup/FIX.4.2-GENERATEFILENAME-TEST.event.backup.4.log") );
  CHECK( file_exists("log/backup/FIX.4.2-GENERATEFILENAME-TEST.messages.backup.4.log") );
}